

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

void __thiscall NaPetriNet::~NaPetriNet(NaPetriNet *this)

{
  undefined8 *in_RDI;
  NaInfoStand *unaff_retaddr;
  
  *in_RDI = &PTR__NaPetriNet_00196440;
  if (in_RDI[0x12] != 0) {
    fclose((FILE *)in_RDI[0x12]);
  }
  if ((long *)in_RDI[0xf] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0xf] + 8))();
  }
  if ((void *)in_RDI[6] != (void *)0x0) {
    operator_delete__((void *)in_RDI[6]);
  }
  NaDynAr<NaPetriNode_*>::~NaDynAr((NaDynAr<NaPetriNode_*> *)0x157a1c);
  NaInfoStand::~NaInfoStand(unaff_retaddr);
  return;
}

Assistant:

NaPetriNet::~NaPetriNet ()
{
    if(NULL != fpDig)
	fclose(fpDig);
    delete dfTimeChart;
    delete[] szName;
}